

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O0

const_iterator __thiscall QAssociativeIterable::find(QAssociativeIterable *this,QVariant *key)

{
  long lVar1;
  void *pvVar2;
  void *extraout_RDX;
  QVariantTypeCoercer *in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar3;
  void *keyData;
  QMetaAssociation meta;
  QVariantTypeCoercer coercer;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffff28;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffff30;
  QMetaAssociation *in_stack_ffffffffffffff38;
  QMetaType *in_stack_ffffffffffffff40;
  QVariant *in_stack_ffffffffffffff48;
  QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
  this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d = (quintptr)in_RDI;
  QIterable<QMetaAssociation>::metaContainer(in_stack_ffffffffffffff30);
  QtPrivate::QVariantTypeCoercer::QVariantTypeCoercer((QVariantTypeCoercer *)0x3334fc);
  QMetaAssociation::keyMetaType((QMetaAssociation *)in_stack_ffffffffffffff30);
  pvVar2 = QtPrivate::QVariantTypeCoercer::convert
                     (in_RDI,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (pvVar2 == (void *)0x0) {
    constEnd((QAssociativeIterable *)in_RDI);
  }
  else {
    QIterable<QMetaAssociation>::constIterable((QIterable<QMetaAssociation> *)0x333568);
    QMetaAssociation::createConstIteratorAtKey
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QConstIterator<QMetaAssociation>::QConstIterator
              ((QConstIterator<QMetaAssociation> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,(void *)0x3335a4);
    QAssociativeConstIterator::QAssociativeConstIterator
              ((QAssociativeConstIterator *)in_stack_ffffffffffffff30,
               (QConstIterator<QMetaAssociation> *)in_stack_ffffffffffffff28);
    QTaggedIterator<QAssociativeConstIterator,_void>::QTaggedIterator
              ((QTaggedIterator<QAssociativeConstIterator,_void> *)this_00.d,
               (QAssociativeConstIterator *)in_RDI);
    QAssociativeConstIterator::~QAssociativeConstIterator((QAssociativeConstIterator *)0x3335de);
    QConstIterator<QMetaAssociation>::~QConstIterator((QConstIterator<QMetaAssociation> *)0x3335eb);
  }
  QtPrivate::QVariantTypeCoercer::~QVariantTypeCoercer((QVariantTypeCoercer *)0x333674);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    cVar3.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
    cVar3.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
            )this_00.d;
    return (const_iterator)
           cVar3.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
           super_QBaseIterator<QMetaAssociation>;
  }
  __stack_chk_fail();
}

Assistant:

QAssociativeIterable::const_iterator QAssociativeIterable::find(const QVariant &key) const
{
    const QMetaAssociation meta = metaContainer();
    QtPrivate::QVariantTypeCoercer coercer;
    if (const void *keyData = coercer.convert(key, meta.keyMetaType())) {
        return const_iterator(QConstIterator(this, meta.createConstIteratorAtKey(
                                                 constIterable(), keyData)));
    }
    return constEnd();
}